

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  int *piVar4;
  Allocator *pAVar5;
  ulong uVar6;
  size_t sVar7;
  bool bVar8;
  Mat *pMVar9;
  uint uVar10;
  int iVar11;
  uint extraout_EAX;
  uint extraout_EAX_00;
  uint extraout_EAX_01;
  uint extraout_EAX_02;
  uint extraout_EAX_03;
  uint extraout_EAX_04;
  undefined4 uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  size_t sVar17;
  int iVar18;
  long lVar19;
  int ref_w;
  int iVar20;
  int ref_h;
  int iVar21;
  Mat *this_00;
  void *pvVar22;
  long lVar23;
  void *pvVar24;
  int h;
  long lVar25;
  int _woffset;
  int _hoffset;
  int _outw;
  int _outc;
  int _outh;
  int _coffset;
  int _outd;
  long local_170;
  Mat m_1;
  long local_118;
  int _doffset;
  Option *local_108;
  size_t local_100;
  Mat *local_f8;
  long local_f0;
  Mat m;
  Mat m_2;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar11 = pMVar3->w;
  local_f0 = CONCAT44(local_f0._4_4_,pMVar3->h);
  iVar16 = pMVar3->d;
  iVar1 = pMVar3->c;
  iVar2 = pMVar3->dims;
  local_100 = pMVar3->elemsize;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _coffset = -1;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  local_108 = opt;
  if (((this->starts_expr)._M_string_length == 0) || ((this->ends_expr)._M_string_length == 0)) {
    uVar10 = this->woffset;
    if (uVar10 == 0xffffff17) {
      uVar10 = iVar2 - 1;
      iVar14 = 0;
      if (uVar10 < 4) {
        iVar14 = iVar2;
      }
      if (iVar14 - 1U < 4) {
        piVar4 = (int *)pMVar3[1].data;
        switch(iVar14) {
        case 1:
          _woffset = *piVar4;
          uVar10 = piVar4[3];
          _outw = uVar10;
          break;
        case 2:
          _woffset = *piVar4;
          _hoffset = piVar4[1];
          uVar10 = piVar4[4];
          _outw = piVar4[3];
          _outh = uVar10;
          break;
        case 3:
          _woffset = *piVar4;
          _hoffset = piVar4[1];
          _coffset = piVar4[2];
          _outw = piVar4[3];
          _outh = piVar4[4];
          uVar10 = piVar4[5];
          _outc = uVar10;
          break;
        case 4:
          _woffset = *piVar4;
          _hoffset = piVar4[1];
          _doffset = piVar4[2];
          _coffset = piVar4[3];
          _outw = piVar4[4];
          _outh = piVar4[5];
          _outd = piVar4[6];
          uVar10 = piVar4[7];
          _outc = uVar10;
        }
      }
    }
    else {
      iVar15 = 0;
      iVar14 = 0;
      iVar18 = 0;
      switch(iVar2) {
      case 1:
        iVar14 = 1;
        iVar18 = 1;
        break;
      case 2:
        iVar18 = 2;
        iVar14 = 1;
        break;
      case 3:
        iVar14 = pMVar3->elempack * iVar1;
        iVar18 = 3;
        break;
      case 4:
        iVar14 = pMVar3->elempack * iVar1;
        iVar18 = 4;
      }
      switch(pMVar3[1].dims) {
      case 1:
        iVar20 = pMVar3[1].elempack * pMVar3[1].w;
        iVar15 = 1;
        iVar21 = 1;
        break;
      case 2:
        iVar20 = pMVar3[1].w;
        iVar21 = pMVar3[1].elempack * pMVar3[1].h;
        iVar15 = 1;
        break;
      case 3:
        iVar20 = pMVar3[1].w;
        iVar15 = pMVar3[1].elempack * pMVar3[1].c;
        iVar21 = pMVar3[1].h;
        break;
      case 4:
        iVar20 = pMVar3[1].w;
        iVar21 = pMVar3[1].h;
        iVar15 = pMVar3[1].elempack * pMVar3[1].c;
        break;
      default:
        iVar21 = 0;
        iVar20 = 0;
      }
      if (iVar18 - 1U < 4) {
        iVar11 = (*(code *)(&DAT_005f3a48 + *(int *)(&DAT_005f3a48 + (ulong)(iVar18 - 1U) * 4)))
                           (this,&DAT_005f3a48 + *(int *)(&DAT_005f3a48 + (ulong)(iVar18 - 1U) * 4),
                            iVar15,iVar14,iVar20,iVar21);
        return iVar11;
      }
    }
  }
  else {
    uVar10 = eval_crop_expr(this,bottom_blobs,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,
                            &_outd,&_outc);
  }
  sVar17 = local_100;
  local_f8 = this_00;
  if (iVar2 == 3) {
    if (_outc != iVar1 || (_outh != (int)local_f0 || _outw != iVar11)) {
      m.h = pMVar3->h;
      m.d = pMVar3->d;
      uVar13 = pMVar3->elemsize;
      m.data = (void *)((long)_coffset * pMVar3->cstep * uVar13 + (long)pMVar3->data);
      m.elempack = pMVar3->elempack;
      m.allocator = pMVar3->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar13;
      m.elemsize._4_4_ = (undefined4)(uVar13 >> 0x20);
      m.c = _outc;
      m.cstep = ((long)pMVar3->d * uVar13 * (long)pMVar3->h * (long)pMVar3->w + 0xf &
                0xfffffffffffffff0) / uVar13;
      m.dims = pMVar3->dims;
      m.w = pMVar3->w;
      if (_outh != (int)local_f0 || _outw != iVar11) {
        Mat::create(this_00,_outw,_outh,_outc,local_100,local_108->blob_allocator);
        local_170 = CONCAT44(local_170._4_4_,0xffffff9c);
        if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) {
          bVar8 = false;
        }
        else {
          if (0 < _outc) {
            lVar23 = 0;
            do {
              lVar19 = (long)m.w;
              uVar13 = CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize);
              m_1.data = (void *)(m.cstep * lVar23 * uVar13 + (long)m.data);
              m_1.refcount._0_4_ = 0;
              m_1.refcount._4_4_ = 0;
              m_1.elemsize._0_4_ = (undefined4)m.elemsize;
              m_1.elemsize._4_4_ = m.elemsize._4_4_;
              m_1.elempack = m.elempack;
              m_1.allocator = m.allocator;
              m_1.h = m.h;
              m_1.d = 1;
              m_1.c = m.d;
              m_1.w = m.w;
              m_1.dims = m.dims + -1;
              m_1.cstep = (uVar13 * m.h * lVar19 + 0xf & 0xfffffffffffffff0) / uVar13;
              if (m.dims == 4) {
                m_1.cstep = m.h * lVar19;
              }
              uVar10 = this_00->w;
              lVar25 = (long)(int)uVar10;
              iVar14 = this_00->h;
              uVar6 = this_00->elemsize;
              pvVar22 = (void *)(this_00->cstep * lVar23 * uVar6 + (long)this_00->data);
              m_2.c = this_00->d;
              m_2.elempack = this_00->elempack;
              m_2.allocator = this_00->allocator;
              m_2.refcount._0_4_ = 0;
              m_2.refcount._4_4_ = 0;
              m_2.elemsize._0_4_ = (undefined4)uVar6;
              m_2.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
              m_2.d = 1;
              m_2.w = uVar10;
              m_2.dims = this_00->dims + -1;
              m_2.cstep = (uVar6 * iVar14 * lVar25 + 0xf & 0xfffffffffffffff0) / uVar6;
              if (this_00->dims == 4) {
                m_2.cstep = iVar14 * lVar25;
              }
              m_2.data = pvVar22;
              m_2.h = iVar14;
              if (sVar17 == 4) {
LAB_0027f4f9:
                copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
              }
              else if (sVar17 == 2) {
LAB_0027f4d9:
                copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
                if (sVar17 == 4) goto LAB_0027f4f9;
              }
              else if (sVar17 == 1) {
                if (0 < iVar14) {
                  pvVar24 = (void *)((long)m_1.data +
                                    uVar13 * lVar19 * (long)_hoffset + (long)_woffset);
                  iVar15 = 0;
                  local_170 = lVar25;
                  do {
                    if ((int)lVar25 < 0xc) {
                      if (0 < (int)uVar10) {
                        uVar13 = 0;
                        do {
                          *(undefined1 *)((long)pvVar22 + uVar13) =
                               *(undefined1 *)((long)pvVar24 + uVar13);
                          uVar13 = uVar13 + 1;
                        } while (uVar10 != uVar13);
                      }
                    }
                    else {
                      memcpy(pvVar22,pvVar24,(ulong)uVar10);
                      lVar25 = local_170;
                    }
                    pvVar22 = (void *)((long)pvVar22 + lVar25);
                    pvVar24 = (void *)((long)pvVar24 + lVar19);
                    iVar15 = iVar15 + 1;
                  } while (iVar15 != iVar14);
                }
                sVar17 = local_100;
                this_00 = local_f8;
                if (local_100 == 4) goto LAB_0027f4f9;
                if (local_100 == 2) goto LAB_0027f4d9;
              }
              m_2.cstep = 0;
              m_2.data = (void *)0x0;
              m_2.refcount._0_4_ = 0;
              m_2.refcount._4_4_ = 0;
              m_2.elemsize._0_4_ = 0;
              m_2.elemsize._4_4_ = 0;
              m_2.elempack = 0;
              m_2.dims = 0;
              m_2.w = 0;
              m_2.h = 0;
              m_2.d = 0;
              m_2.c = 0;
              piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    if (m_1.data != (void *)0x0) {
                      free(m_1.data);
                    }
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              m_1.cstep = 0;
              m_1.data = (void *)0x0;
              m_1.refcount._0_4_ = 0;
              m_1.refcount._4_4_ = 0;
              m_1.elemsize._0_4_ = 0;
              m_1.elemsize._4_4_ = 0;
              m_1.elempack = 0;
              m_1.dims = 0;
              m_1.w = 0;
              m_1.h = 0;
              m_1.d = 0;
              m_1.c = 0;
              lVar23 = lVar23 + 1;
            } while (lVar23 < _outc);
          }
          bVar8 = true;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,local_108->blob_allocator,_outc,(void *)(ulong)(uint)_outh);
        this_00 = local_f8;
        if (local_f8 != &m_1) {
          piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = local_f8->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_f8->allocator == (Allocator *)0x0) {
                if (local_f8->data != (void *)0x0) {
                  free(local_f8->data);
                }
              }
              else {
                (*local_f8->allocator->_vptr_Allocator[3])();
              }
            }
          }
          this_00->cstep = 0;
          this_00->data = (void *)0x0;
          this_00->refcount = (int *)0x0;
          *(undefined8 *)((long)&this_00->refcount + 4) = 0;
          *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
          this_00->dims = 0;
          this_00->w = 0;
          this_00->h = 0;
          this_00->d = 0;
          this_00->c = 0;
          this_00->data = m_1.data;
          this_00->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          this_00->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
          this_00->elempack = m_1.elempack;
          this_00->allocator = m_1.allocator;
          this_00->dims = m_1.dims;
          this_00->w = m_1.w;
          this_00->h = m_1.h;
          this_00->d = m_1.d;
          this_00->c = m_1.c;
          this_00->cstep = m_1.cstep;
        }
        piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bVar8 = false;
        if (this_00->data == (void *)0x0) {
          local_170 = CONCAT44(local_170._4_4_,0xffffff9c);
        }
        else {
          uVar12 = 0xffffff9c;
          if ((long)this_00->c * this_00->cstep != 0) {
            uVar12 = 0;
          }
          local_170 = CONCAT44(local_170._4_4_,uVar12);
        }
      }
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      uVar10 = (uint)local_170;
      if (!bVar8) {
        return (uint)local_170;
      }
      goto LAB_0027f744;
    }
    if (this_00 == pMVar3) {
      return 0;
    }
    piVar4 = pMVar3->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = this_00->refcount;
    if (piVar4 == (int *)0x0) goto LAB_0027fca9;
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) goto LAB_0027fca9;
    pvVar22 = this_00->data;
    pAVar5 = this_00->allocator;
  }
  else {
    if (iVar2 == 2) {
      if (_outh == (int)local_f0 && _outw == iVar11) {
        if (this_00 == pMVar3) {
          return 0;
        }
        piVar4 = pMVar3->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = this_00->refcount;
        if (piVar4 == (int *)0x0) goto LAB_0027fca9;
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 != 0) goto LAB_0027fca9;
        pvVar22 = this_00->data;
        pAVar5 = this_00->allocator;
        goto joined_r0x0027f123;
      }
      Mat::create(this_00,_outw,_outh,local_100,local_108->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return 0xffffff9c;
      }
      uVar10 = 0xffffff9c;
      if ((long)this_00->c * this_00->cstep == 0) {
        return 0xffffff9c;
      }
      if (sVar17 == 4) {
        copy_cut_border_image<float>(pMVar3,this_00,_hoffset,_woffset);
        uVar10 = extraout_EAX_04;
      }
      else if (sVar17 == 2) {
        copy_cut_border_image<unsigned_short>(pMVar3,this_00,_hoffset,_woffset);
        uVar10 = extraout_EAX_03;
      }
      else if (sVar17 == 1) {
        copy_cut_border_image<signed_char>(pMVar3,this_00,_hoffset,_woffset);
        uVar10 = extraout_EAX_02;
      }
    }
    else if (iVar2 == 1) {
      if (_outw == iVar11) {
        if (this_00 == pMVar3) {
          return 0;
        }
        piVar4 = pMVar3->refcount;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + 1;
          UNLOCK();
        }
        piVar4 = this_00->refcount;
        if (piVar4 == (int *)0x0) goto LAB_0027fca9;
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 != 0) goto LAB_0027fca9;
        pvVar22 = this_00->data;
        pAVar5 = this_00->allocator;
        goto joined_r0x0027f123;
      }
      Mat::create(this_00,_outw,local_100,local_108->blob_allocator);
      if (this_00->data == (void *)0x0) {
        return 0xffffff9c;
      }
      uVar10 = 0xffffff9c;
      if ((long)this_00->c * this_00->cstep == 0) {
        return 0xffffff9c;
      }
      if (sVar17 == 4) {
        copy_cut_border_image<float>(pMVar3,this_00,0,_woffset);
        uVar10 = extraout_EAX_01;
      }
      else if (sVar17 == 2) {
        copy_cut_border_image<unsigned_short>(pMVar3,this_00,0,_woffset);
        uVar10 = extraout_EAX_00;
      }
      else if (sVar17 == 1) {
        copy_cut_border_image<signed_char>(pMVar3,this_00,0,_woffset);
        uVar10 = extraout_EAX;
      }
    }
LAB_0027f744:
    pMVar9 = local_f8;
    sVar17 = local_100;
    if (iVar2 != 4) {
      return 0;
    }
    local_170 = CONCAT44(local_170._4_4_,uVar10);
    bVar8 = iVar16 != _outd;
    if (_outc != iVar1 || (bVar8 || ((int)local_f0 != _outh || iVar11 != _outw))) {
      m.h = pMVar3->h;
      m.d = pMVar3->d;
      uVar13 = pMVar3->elemsize;
      m.data = (void *)((long)_coffset * pMVar3->cstep * uVar13 + (long)pMVar3->data);
      m.elempack = pMVar3->elempack;
      m.allocator = pMVar3->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar13;
      m.elemsize._4_4_ = (undefined4)(uVar13 >> 0x20);
      m.c = _outc;
      m.cstep = ((long)pMVar3->d * uVar13 * (long)pMVar3->h * (long)pMVar3->w + 0xf &
                0xfffffffffffffff0) / uVar13;
      m.dims = pMVar3->dims;
      m.w = pMVar3->w;
      if (bVar8 || ((int)local_f0 != _outh || iVar11 != _outw)) {
        Mat::create(local_f8,_outw,_outh,_outd,_outc,local_100,local_108->blob_allocator);
        if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) {
          if (0 < _outc) {
            local_118 = 0;
            do {
              if (0 < _outd) {
                lVar23 = 0;
                do {
                  m_1.cstep = (long)m.h * (long)m.w;
                  m_1.data = (void *)((long)m.data +
                                     ((long)(int)lVar23 + (long)_doffset) *
                                     CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) * m_1.cstep +
                                     m.cstep * local_118 *
                                     CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize));
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = (undefined4)m.elemsize;
                  m_1.elemsize._4_4_ = m.elemsize._4_4_;
                  m_1.elempack = m.elempack;
                  m_1.allocator = m.allocator;
                  m_1.w = m.w;
                  m_1.dims = 2;
                  m_1.h = m.h;
                  m_1.d = 1;
                  m_1.c = 1;
                  uVar10 = local_f8->w;
                  sVar7 = local_f8->elemsize;
                  iVar11 = local_f8->h;
                  m_2.elempack = local_f8->elempack;
                  m_2.cstep = (long)iVar11 * (long)(int)uVar10;
                  pvVar22 = (void *)((long)local_f8->data +
                                    lVar23 * sVar7 * m_2.cstep + local_f8->cstep * local_118 * sVar7
                                    );
                  m_2.allocator = local_f8->allocator;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = (undefined4)sVar7;
                  m_2.elemsize._4_4_ = (undefined4)(sVar7 >> 0x20);
                  m_2.w = uVar10;
                  m_2.dims = 2;
                  m_2.d = 1;
                  m_2.c = 1;
                  m_2.data = pvVar22;
                  m_2.h = iVar11;
                  if (sVar17 == 4) {
LAB_0027fb7b:
                    copy_cut_border_image<float>(&m_1,&m_2,_hoffset,_woffset);
                  }
                  else if (sVar17 == 2) {
LAB_0027fb5b:
                    copy_cut_border_image<unsigned_short>(&m_1,&m_2,_hoffset,_woffset);
                    if (sVar17 == 4) goto LAB_0027fb7b;
                  }
                  else if (sVar17 == 1) {
                    if (0 < iVar11) {
                      lVar19 = (long)(int)uVar10;
                      lVar25 = (long)m.w;
                      pvVar24 = (void *)((long)m_1.data +
                                        (long)_woffset +
                                        _hoffset * lVar25 *
                                        CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize));
                      iVar16 = 0;
                      local_f0 = lVar19;
                      do {
                        if ((int)uVar10 < 0xc) {
                          if (0 < (int)lVar19) {
                            uVar13 = 0;
                            do {
                              *(undefined1 *)((long)pvVar22 + uVar13) =
                                   *(undefined1 *)((long)pvVar24 + uVar13);
                              uVar13 = uVar13 + 1;
                            } while (uVar10 != uVar13);
                          }
                        }
                        else {
                          memcpy(pvVar22,pvVar24,(ulong)uVar10);
                          lVar19 = local_f0;
                        }
                        pvVar22 = (void *)((long)pvVar22 + lVar19);
                        pvVar24 = (void *)((long)pvVar24 + lVar25);
                        iVar16 = iVar16 + 1;
                      } while (iVar16 != iVar11);
                    }
                    sVar17 = local_100;
                    if (local_100 == 4) goto LAB_0027fb7b;
                    if (local_100 == 2) goto LAB_0027fb5b;
                  }
                  piVar4 = (int *)CONCAT44(m_2.refcount._4_4_,m_2.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (m_2.allocator == (Allocator *)0x0) {
                        if (m_2.data != (void *)0x0) {
                          free(m_2.data);
                        }
                      }
                      else {
                        (*(m_2.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_2.cstep = 0;
                  m_2.data = (void *)0x0;
                  m_2.refcount._0_4_ = 0;
                  m_2.refcount._4_4_ = 0;
                  m_2.elemsize._0_4_ = 0;
                  m_2.elemsize._4_4_ = 0;
                  m_2.elempack = 0;
                  m_2.dims = 0;
                  m_2.w = 0;
                  m_2.h = 0;
                  m_2.d = 0;
                  m_2.c = 0;
                  piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      if (m_1.allocator == (Allocator *)0x0) {
                        if (m_1.data != (void *)0x0) {
                          free(m_1.data);
                        }
                      }
                      else {
                        (*(m_1.allocator)->_vptr_Allocator[3])();
                      }
                    }
                  }
                  m_1.cstep = 0;
                  m_1.data = (void *)0x0;
                  m_1.refcount._0_4_ = 0;
                  m_1.refcount._4_4_ = 0;
                  m_1.elemsize._0_4_ = 0;
                  m_1.elemsize._4_4_ = 0;
                  m_1.elempack = 0;
                  m_1.dims = 0;
                  m_1.w = 0;
                  m_1.h = 0;
                  m_1.d = 0;
                  m_1.c = 0;
                  lVar23 = lVar23 + 1;
                } while (lVar23 < _outd);
              }
              local_118 = local_118 + 1;
            } while (local_118 < _outc);
          }
          bVar8 = true;
          goto LAB_0027fded;
        }
      }
      else {
        Mat::clone(&m_1,(__fn *)&m,local_108->blob_allocator,_outd,(void *)(ulong)(uint)_outc);
        pMVar3 = local_f8;
        if (local_f8 != &m_1) {
          piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + 1;
            UNLOCK();
          }
          piVar4 = local_f8->refcount;
          if (piVar4 != (int *)0x0) {
            LOCK();
            *piVar4 = *piVar4 + -1;
            UNLOCK();
            if (*piVar4 == 0) {
              if (local_f8->allocator == (Allocator *)0x0) {
                if (local_f8->data != (void *)0x0) {
                  free(local_f8->data);
                }
              }
              else {
                (*local_f8->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar3->cstep = 0;
          pMVar3->data = (void *)0x0;
          pMVar3->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar3->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar3->elemsize + 4) = 0;
          pMVar3->dims = 0;
          pMVar3->w = 0;
          pMVar3->h = 0;
          pMVar3->d = 0;
          pMVar3->c = 0;
          pMVar3->data = m_1.data;
          pMVar3->refcount = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          pMVar3->elemsize = CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize);
          pMVar3->elempack = m_1.elempack;
          pMVar3->allocator = m_1.allocator;
          pMVar3->dims = m_1.dims;
          pMVar3->w = m_1.w;
          pMVar3->h = m_1.h;
          pMVar3->d = m_1.d;
          pMVar3->c = m_1.c;
          pMVar3->cstep = m_1.cstep;
        }
        piVar4 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        bVar8 = false;
        if (pMVar3->data != (void *)0x0) {
          uVar12 = 0xffffff9c;
          if ((long)pMVar3->c * pMVar3->cstep != 0) {
            uVar12 = 0;
          }
          local_170 = CONCAT44(local_170._4_4_,uVar12);
          goto LAB_0027fded;
        }
      }
      bVar8 = false;
      local_170 = CONCAT44(local_170._4_4_,0xffffff9c);
LAB_0027fded:
      piVar4 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (bVar8) {
        return 0;
      }
      return (uint)local_170;
    }
    if (this_00 == pMVar3) {
      return 0;
    }
    piVar4 = pMVar3->refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = this_00->refcount;
    if (piVar4 == (int *)0x0) goto LAB_0027fca9;
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) goto LAB_0027fca9;
    pvVar22 = this_00->data;
    pAVar5 = this_00->allocator;
  }
joined_r0x0027f123:
  if (pAVar5 == (Allocator *)0x0) {
    if (pvVar22 != (void *)0x0) {
      free(pvVar22);
    }
  }
  else {
    (*pAVar5->_vptr_Allocator[3])();
  }
LAB_0027fca9:
  this_00->cstep = 0;
  this_00->data = (void *)0x0;
  this_00->refcount = (int *)0x0;
  *(undefined8 *)((long)&this_00->refcount + 4) = 0;
  *(undefined8 *)((long)&this_00->elemsize + 4) = 0;
  this_00->dims = 0;
  this_00->w = 0;
  this_00->h = 0;
  this_00->d = 0;
  this_00->c = 0;
  piVar4 = pMVar3->refcount;
  this_00->data = pMVar3->data;
  this_00->refcount = piVar4;
  this_00->elemsize = pMVar3->elemsize;
  this_00->elempack = pMVar3->elempack;
  this_00->allocator = pMVar3->allocator;
  iVar11 = pMVar3->w;
  iVar16 = pMVar3->h;
  iVar1 = pMVar3->d;
  this_00->dims = pMVar3->dims;
  this_00->w = iVar11;
  this_00->h = iVar16;
  this_00->d = iVar1;
  this_00->c = pMVar3->c;
  this_00->cstep = pMVar3->cstep;
  return 0;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _doffset, _coffset = -1;
    int _outw = -1, _outh = -1, _outd = -1, _outc;

    if (!starts_expr.empty() && !ends_expr.empty())
    {
        eval_crop_expr(bottom_blobs, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone(opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }
    }

    return 0;
}